

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  bool local_1bd;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string suffix;
  string prefix;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  char *local_68;
  char *version;
  undefined1 local_58 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  Names *targetNames;
  
  Names::Names(__return_storage_ptr__);
  bVar1 = IsImported(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"GetExecutableNames called on imported target: ",
               (allocator<char> *)((long)&version + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&version + 7));
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator+=((string *)local_58,(string *)psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"VERSION",&local_89);
  pcVar4 = GetProperty(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  prefix.field_2._M_local_buf[0xe] = '\0';
  prefix.field_2._M_local_buf[0xd] = '\0';
  local_68 = pcVar4;
  TVar2 = GetType(this);
  local_1bd = true;
  if (TVar2 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    prefix.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"XCODE",(allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    prefix.field_2._M_local_buf[0xd] = '\x01';
    local_1bd = cmMakefile::IsOn(this_00,&local_b0);
  }
  if ((prefix.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((prefix.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
  }
  if (local_1bd != false) {
    local_68 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f8);
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,(string *)(suffix.field_2._M_local_buf + 8),
                      &__return_storage_ptr__->Base,(string *)local_f8);
  std::operator+(&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),&__return_storage_ptr__->Base);
  std::operator+(&local_118,&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->Real,(string *)&__return_storage_ptr__->Output);
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,"-");
    std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,local_68);
  }
  GetFullNameInternal(&local_158,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  GetPDBName(&local_178,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The executable name.
  targetNames.Output = prefix + targetNames.Base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}